

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zeRTASBuilderCreateExp
          (ze_driver_handle_t hDriver,ze_rtas_builder_exp_desc_t *pDescriptor,
          ze_rtas_builder_exp_handle_t *phBuilder)

{
  ze_pfnRTASBuilderCreateExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_rtas_builder_exp_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hDriver + 8);
  p_Var1 = (local_10->ze).RTASBuilderExp.pfnCreateExp;
  if (p_Var1 == (ze_pfnRTASBuilderCreateExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_driver_handle_t *)hDriver,pDescriptor,phBuilder);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_rtas_builder_exp_handle_t*>,_ze_rtas_builder_exp_handle_t*>
               ::getInstance<_ze_rtas_builder_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_rtas_builder_exp_handle_t*>,_ze_rtas_builder_exp_handle_t*>
                           *)(context + 0x600),phBuilder,&local_10);
      *phBuilder = (ze_rtas_builder_exp_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderCreateExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        const ze_rtas_builder_exp_desc_t* pDescriptor,  ///< [in] pointer to builder descriptor
        ze_rtas_builder_exp_handle_t* phBuilder         ///< [out] handle of builder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnCreateExp = dditable->ze.RTASBuilderExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnCreateExp( hDriver, pDescriptor, phBuilder );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phBuilder = reinterpret_cast<ze_rtas_builder_exp_handle_t>(
                context->ze_rtas_builder_exp_factory.getInstance( *phBuilder, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }